

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O3

int Gia_ManCountRanks(Gia_Man_t *p)

{
  uint Rank;
  bool bVar1;
  uint uVar2;
  Vec_Int_t *vRanks;
  int *__s;
  int *piVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar4;
  int i;
  ulong uVar5;
  long lVar6;
  int Counter;
  ulong uVar7;
  int Counter_1;
  int iVar8;
  int iVar9;
  long lVar10;
  Vec_Int_t *local_48;
  int *local_40;
  
  iVar8 = p->nObjs;
  vRanks = (Vec_Int_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar8 - 1U) {
    iVar9 = iVar8;
  }
  vRanks->nCap = iVar9;
  if (iVar9 == 0) {
    __s = (int *)0x0;
    vRanks->pArray = (int *)0x0;
    vRanks->nSize = iVar8;
    local_48 = (Vec_Int_t *)malloc(0x10);
    local_48->nCap = 0;
    local_48->pArray = (int *)0x0;
    local_48->nSize = iVar8;
  }
  else {
    __s = (int *)malloc((long)iVar9 << 2);
    vRanks->pArray = __s;
    vRanks->nSize = iVar8;
    if (__s != (int *)0x0) {
      memset(__s,0xff,(long)iVar8 * 4);
    }
    local_48 = (Vec_Int_t *)malloc(0x10);
    local_48->nCap = iVar9;
    piVar3 = (int *)malloc((long)iVar9 << 2);
    local_48->pArray = piVar3;
    local_48->nSize = iVar8;
    if (piVar3 != (int *)0x0) {
      memset(piVar3,0,(long)iVar8 << 2);
    }
  }
  local_40 = &local_48->nSize;
  if (p->vCos->nSize <= p->nRegs) {
    __assert_fail("Gia_ManPoNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcS.c"
                  ,0x14c,"int Gia_ManCountRanks(Gia_Man_t *)");
  }
  Gia_ManIncrementTravId(p);
  if (p->nTravIdsAlloc < 1) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x266,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
  }
  *p->pTravIds = p->nTravIds;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar3 = (int *)malloc(400);
  p_00->pArray = piVar3;
  pVVar4 = p->vCos;
  uVar5 = (ulong)(uint)pVVar4->nSize;
  if (p->nRegs < pVVar4->nSize) {
    lVar10 = 0;
    do {
      if ((int)uVar5 <= lVar10) {
LAB_0057d225:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar8 = pVVar4->pArray[lVar10];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Vec_IntPush(p_00,iVar8 - (*(uint *)(p->pObjs + iVar8) & 0x1fffffff));
      lVar10 = lVar10 + 1;
      pVVar4 = p->vCos;
      uVar5 = (ulong)pVVar4->nSize;
    } while (lVar10 < (long)(uVar5 - (long)p->nRegs));
    if (0 < p_00->nSize) {
      Rank = 0;
      uVar5 = 0;
      uVar2 = p_00->nSize;
      do {
        uVar7 = uVar5;
        do {
          if (((int)uVar5 < 0) || (p_00->nSize <= (int)uVar7)) goto LAB_0057d225;
          Gia_ManCountRanks_rec(p,p_00->pArray[uVar7],p_00,vRanks,local_48,Rank);
          uVar7 = uVar7 + 1;
        } while ((int)uVar7 < (int)uVar2);
        Rank = Rank + 1;
        bVar1 = (int)uVar2 < p_00->nSize;
        uVar5 = (ulong)uVar2;
        uVar2 = p_00->nSize;
      } while (bVar1);
      goto LAB_0057d151;
    }
  }
  Rank = 0;
LAB_0057d151:
  lVar10 = (long)*local_40;
  if (lVar10 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  piVar3 = local_48->pArray;
  *piVar3 = 0;
  lVar6 = 0;
  uVar5 = 0;
  do {
    uVar5 = (ulong)(uint)((int)uVar5 + piVar3[lVar6]);
    lVar6 = lVar6 + 1;
  } while (lVar10 != lVar6);
  lVar6 = 0;
  iVar8 = 0;
  do {
    iVar8 = iVar8 + piVar3[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar10 != lVar6);
  iVar9 = p->vCis->nSize;
  printf("Tents = %6d.   Cands = %6d.  %10.2f %%\n",
         ((double)iVar8 * 100.0) / (double)(iVar9 + p->nObjs + ~(p->vCos->nSize + iVar9)),
         (ulong)Rank,uVar5);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  if (__s != (int *)0x0) {
    free(__s);
  }
  free(vRanks);
  free(piVar3);
  free(local_48);
  return Rank;
}

Assistant:

int Gia_ManCountRanks( Gia_Man_t * p )
{
    Vec_Int_t * vRoots;
    Vec_Int_t * vRanks = Vec_IntStartFull( Gia_ManObjNum(p) );
    Vec_Int_t * vCands = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj;  
    int t, i, iObj, nSizeCurr = 0;
    assert( Gia_ManPoNum(p) > 0 );
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrentId( p, 0 );
    vRoots = Vec_IntAlloc( 100 );
    Gia_ManForEachPo( p, pObj, i )
        Vec_IntPush( vRoots, Gia_ObjFaninId0p(p, pObj) );
    for ( t = 0; nSizeCurr < Vec_IntSize(vRoots); t++ )
    {
        int nSizePrev = nSizeCurr;
        nSizeCurr = Vec_IntSize(vRoots);
        Vec_IntForEachEntryStartStop( vRoots, iObj, i, nSizePrev, nSizeCurr )
            Gia_ManCountRanks_rec( p, iObj, vRoots, vRanks, vCands, t );
    }
    Vec_IntWriteEntry( vCands, 0, 0 );
    printf( "Tents = %6d.   Cands = %6d.  %10.2f %%\n", t, Vec_IntSum(vCands), 100.0*Vec_IntSum(vCands)/Gia_ManCandNum(p) );
    Vec_IntFree( vRoots );
    Vec_IntFree( vRanks );
    Vec_IntFree( vCands );
    return t;
}